

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parsing.h
# Opt level: O2

void __thiscall Parsing::Parsing(Parsing *this)

{
  EVP_PKEY_CTX *ctx;
  
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  (this->content)._M_string_length = 0;
  (this->content).field_2._M_local_buf[0] = '\0';
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ctx = (EVP_PKEY_CTX *)0x0;
  memset(&this->contentLine,0,0x8c);
  init(this,ctx);
  return;
}

Assistant:

Parsing() {
	    reservationBase = divisionBase = operationBase = \
	    constBase = identifierBase = 0;
		init();
    }